

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool parseCmakeBoolean(QJsonValue *value)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QStringView QVar11;
  QArrayData *local_a8 [3];
  QArrayData *local_90 [3];
  QArrayData *local_78 [3];
  QArrayData *local_60 [3];
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonValue::toString();
  QVar7.m_data = &DAT_00000004;
  QVar7.m_size = (qsizetype)local_60;
  QString::fromUtf8(QVar7);
  bVar2 = false;
  iVar3 = QString::compare(&local_48,(CaseSensitivity)local_60);
  bVar6 = true;
  if (iVar3 == 0) {
    QVar8.m_data = (storage_type_conflict *)0x2;
    QVar8.m_size = (qsizetype)local_78;
    QString::fromUtf8(QVar8);
    bVar2 = false;
    iVar4 = QString::compare(&local_48,(CaseSensitivity)local_78);
    bVar1 = false;
    if (iVar4 == 0) {
      QVar9.m_data = (storage_type_conflict *)0x3;
      QVar9.m_size = (qsizetype)local_90;
      QString::fromUtf8(QVar9);
      bVar1 = false;
      iVar4 = QString::compare(&local_48,(CaseSensitivity)local_90);
      if (iVar4 == 0) {
        QVar10.m_data = (storage_type_conflict *)0x1;
        QVar10.m_size = (qsizetype)local_a8;
        QString::fromUtf8(QVar10);
        iVar4 = QString::compare(&local_48,(CaseSensitivity)local_a8);
        bVar2 = true;
        if (iVar4 == 0) {
          QVar11.m_data = local_48.d.ptr;
          QVar11.m_size = local_48.d.size;
          lVar5 = QString::toIntegral_helper(QVar11,(bool *)0x0,10);
          bVar6 = lVar5 - 1U < 0x7fffffff;
          bVar1 = true;
          goto LAB_00110c6b;
        }
        bVar1 = true;
      }
      bVar2 = true;
      bVar6 = true;
    }
  }
  else {
    bVar1 = false;
  }
LAB_00110c6b:
  if ((bVar1) && (local_a8[0] != (QArrayData *)0x0)) {
    LOCK();
    (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8[0],2,0x10);
    }
  }
  if ((bVar2) && (local_90[0] != (QArrayData *)0x0)) {
    LOCK();
    (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90[0],2,0x10);
    }
  }
  if ((iVar3 == 0) && (local_78[0] != (QArrayData *)0x0)) {
    LOCK();
    (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78[0],2,0x10);
    }
  }
  if (local_60[0] != (QArrayData *)0x0) {
    LOCK();
    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60[0],2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool parseCmakeBoolean(const QJsonValue &value)
{
    const QString stringValue = value.toString();
    return (stringValue.compare(QString::fromUtf8("true"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("on"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("yes"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("y"), Qt::CaseInsensitive)
                 || stringValue.toInt() > 0);
}